

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::udp_tracker_connection::on_receive_hostname
          (udp_tracker_connection *this,string_view hostname,span<const_char> buf)

{
  bool bVar1;
  span<const_char> local_40;
  udp_tracker_connection *local_30;
  udp_tracker_connection *this_local;
  span<const_char> buf_local;
  string_view hostname_local;
  
  buf_local.m_ptr = (char *)buf.m_len;
  this_local = (udp_tracker_connection *)buf.m_ptr;
  buf_local.m_len = hostname._M_len;
  local_30 = this;
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_40,(span<const_char> *)&this_local);
  bVar1 = on_receive(this,&this->m_target,local_40);
  return bVar1;
}

Assistant:

bool udp_tracker_connection::on_receive_hostname(string_view const hostname
		, span<char const> buf)
	{
		TORRENT_UNUSED(hostname);
		// just ignore the hostname this came from, pretend that
		// it's from the same endpoint we sent it to (i.e. the same
		// port). We have so many other ways of confirming this packet
		// comes from the tracker anyway, so it's not a big deal
		return on_receive(m_target, buf);
	}